

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/command_line_interface.cc:1276:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_compiler_command_line_interface_cc:1276:16)>_>
          *this,Descriptor *descriptor)

{
  EnumDescriptor *this_00;
  FieldDescriptor *pFVar1;
  Descriptor *descriptor_00;
  int iVar2;
  int index;
  
  if (0 < *(int *)(descriptor + 0x84)) {
    iVar2 = 0;
    do {
      this_00 = Descriptor::enum_type(descriptor,iVar2);
      if (0 < *(int *)(this_00 + 4)) {
        index = 0;
        do {
          EnumDescriptor::value(this_00,index);
          index = index + 1;
        } while (index < *(int *)(this_00 + 4));
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(descriptor + 0x84));
  }
  if (0 < *(int *)(descriptor + 0x78)) {
    iVar2 = 0;
    do {
      Descriptor::oneof_decl(descriptor,iVar2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(descriptor + 0x78));
  }
  if (0 < *(int *)(descriptor + 4)) {
    iVar2 = 0;
    do {
      pFVar1 = Descriptor::field(descriptor,iVar2);
      Visit<>(this,pFVar1);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(descriptor + 4));
  }
  if (0 < *(int *)(descriptor + 0x80)) {
    iVar2 = 0;
    do {
      descriptor_00 = Descriptor::nested_type(descriptor,iVar2);
      Visit<>(this,descriptor_00);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(descriptor + 0x80));
  }
  if (0 < *(int *)(descriptor + 0x8c)) {
    iVar2 = 0;
    do {
      pFVar1 = Descriptor::extension(descriptor,iVar2);
      Visit<>(this,pFVar1);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(descriptor + 0x8c));
  }
  if (0 < *(int *)(descriptor + 0x88)) {
    iVar2 = 0;
    do {
      Descriptor::extension_range(descriptor,iVar2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)(descriptor + 0x88));
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }